

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O2

boolean read_restart_marker(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  boolean bVar3;
  int iVar4;
  
  iVar4 = cinfo->unread_marker;
  if (iVar4 == 0) {
    bVar3 = next_marker(cinfo);
    if (bVar3 != 0) {
      iVar4 = cinfo->unread_marker;
      goto LAB_0010c253;
    }
LAB_0010c2ae:
    bVar3 = 0;
  }
  else {
LAB_0010c253:
    iVar1 = cinfo->marker->next_restart_num;
    if (iVar4 == iVar1 + 0xd0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x62;
      (pjVar2->msg_parm).i[0] = iVar1;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,3);
      cinfo->unread_marker = 0;
    }
    else {
      bVar3 = (*cinfo->src->resync_to_restart)(cinfo,iVar1);
      if (bVar3 == 0) goto LAB_0010c2ae;
    }
    cinfo->marker->next_restart_num = cinfo->marker->next_restart_num + 1U & 7;
    bVar3 = 1;
  }
  return bVar3;
}

Assistant:

METHODDEF(boolean)
read_restart_marker(j_decompress_ptr cinfo)
{
  /* Obtain a marker unless we already did. */
  /* Note that next_marker will complain if it skips any data. */
  if (cinfo->unread_marker == 0) {
    if (!next_marker(cinfo))
      return FALSE;
  }

  if (cinfo->unread_marker ==
      ((int)M_RST0 + cinfo->marker->next_restart_num)) {
    /* Normal case --- swallow the marker and let entropy decoder continue */
    TRACEMS1(cinfo, 3, JTRC_RST, cinfo->marker->next_restart_num);
    cinfo->unread_marker = 0;
  } else {
    /* Uh-oh, the restart markers have been messed up. */
    /* Let the data source manager determine how to resync. */
    if (!(*cinfo->src->resync_to_restart) (cinfo,
                                           cinfo->marker->next_restart_num))
      return FALSE;
  }

  /* Update next-restart state */
  cinfo->marker->next_restart_num = (cinfo->marker->next_restart_num + 1) & 7;

  return TRUE;
}